

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathNodeCollectAndTest
              (xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,xmlNodePtr *first,xmlNodePtr *last
              ,int toBool)

{
  double dVar1;
  int iVar2;
  xmlElementType xVar3;
  xmlElementType xVar4;
  xmlChar *prefix;
  xmlChar *str2;
  xmlXPathContextPtr ctxt_00;
  xmlNodeSetPtr pxVar5;
  xmlXPathStepOp *pxVar6;
  int *piVar7;
  xmlNodePtr pxVar8;
  xmlNodePtr pxVar9;
  xmlNs *pxVar10;
  void *pvVar11;
  xmlXPathObjectPtr pxVar12;
  bool bVar13;
  bool bVar14;
  xmlNodeSetPtr pxVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  xmlXPathObjectPtr pxVar20;
  xmlChar *str1;
  code *pcVar21;
  xmlNodeSetPtr cur;
  xmlNodePtr node2;
  long lVar22;
  xmlXPathStepOpPtr op_00;
  int iVar23;
  int iVar24;
  bool bVar25;
  bool bVar26;
  xmlNodePtr *local_d8;
  int local_c8;
  int local_c4;
  xmlNodeSetPtr local_b8;
  xmlNodePtr *local_a8;
  code *local_98;
  
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_NODESET)) {
    iVar23 = 0xb;
LAB_001c7ce8:
    xmlXPathErr(ctxt,iVar23);
    return 0;
  }
  iVar23 = op->value;
  iVar2 = op->value2;
  xVar3 = op->value3;
  prefix = (xmlChar *)op->value4;
  str2 = (xmlChar *)op->value5;
  ctxt_00 = ctxt->context;
  pxVar20 = xmlXPathValuePop(ctxt);
  if (prefix == (xmlChar *)0x0) {
    str1 = (xmlChar *)0x0;
  }
  else {
    str1 = xmlXPathNsLookup(ctxt_00,prefix);
    if (str1 == (xmlChar *)0x0) {
      xmlXPathReleaseObject(ctxt_00,pxVar20);
      iVar23 = 0x13;
      goto LAB_001c7ce8;
    }
  }
  local_98 = xmlXPathNodeSetMergeAndClear;
  local_d8 = last;
  local_a8 = first;
  switch(iVar23) {
  case 1:
    pcVar21 = xmlXPathNextAncestor;
    break;
  case 2:
    pcVar21 = xmlXPathNextAncestorOrSelf;
    break;
  case 3:
    pcVar21 = xmlXPathNextAttribute;
    goto LAB_001c7e04;
  case 4:
    if ((iVar2 - 3U & 0xfffffffd) == 0 && xVar3 == 0) {
      pcVar21 = xmlXPathNextChildElement;
    }
    else {
      pcVar21 = xmlXPathNextChild;
    }
    local_98 = xmlXPathNodeSetMergeAndClearNoDupls;
    local_d8 = (xmlNodePtr *)0x0;
    goto LAB_001c7e16;
  case 5:
    pcVar21 = xmlXPathNextDescendant;
    goto LAB_001c7ddd;
  case 6:
    pcVar21 = xmlXPathNextDescendantOrSelf;
    goto LAB_001c7ddd;
  case 7:
    pcVar21 = xmlXPathNextFollowing;
    goto LAB_001c7ddd;
  case 8:
    pcVar21 = xmlXPathNextFollowingSibling;
LAB_001c7ddd:
    local_d8 = (xmlNodePtr *)0x0;
    goto LAB_001c7e16;
  case 9:
    pcVar21 = xmlXPathNextNamespace;
    goto LAB_001c7e04;
  case 10:
    pcVar21 = xmlXPathNextParent;
    break;
  case 0xb:
    pcVar21 = xmlXPathNextPrecedingInternal;
    break;
  case 0xc:
    pcVar21 = xmlXPathNextPrecedingSibling;
    break;
  case 0xd:
    pcVar21 = xmlXPathNextSelf;
LAB_001c7e04:
    local_98 = xmlXPathNodeSetMergeAndClearNoDupls;
    local_d8 = (xmlNodePtr *)0x0;
    break;
  default:
    pcVar21 = (code *)0x0;
    goto LAB_001c7e16;
  }
  local_a8 = (xmlNodePtr *)0x0;
LAB_001c7e16:
  if (pcVar21 == (code *)0x0) {
    xmlXPathReleaseObject(ctxt_00,pxVar20);
    return 0;
  }
  pxVar5 = pxVar20->nodesetval;
  if ((pxVar5 == (xmlNodeSetPtr)0x0) || (pxVar5->nodeNr < 1)) {
    xmlXPathValuePush(ctxt,pxVar20);
    return 0;
  }
  lVar22 = (long)op->ch2;
  iVar24 = 0;
  if (lVar22 == -1) {
    bVar13 = true;
    local_c8 = 0;
    op_00 = (xmlXPathStepOpPtr)0x0;
    bVar14 = true;
    goto LAB_001c7fa0;
  }
  pxVar6 = ctxt->comp->steps;
  op_00 = pxVar6 + lVar22;
  bVar14 = true;
  local_c8 = 0;
  if (((((1 < pxVar6[lVar22].op - XPATH_OP_PREDICATE) || ((long)op_00->ch2 == -1)) ||
       (pxVar6 == (xmlXPathStepOp *)0x0)) ||
      ((pxVar6[op_00->ch2].op != XPATH_OP_VALUE ||
       (piVar7 = (int *)pxVar6[op_00->ch2].value4, piVar7 == (int *)0x0)))) ||
     ((*piVar7 != 3 || (dVar1 = *(double *)(piVar7 + 6), dVar1 <= -2147483648.0)))) {
LAB_001c7f21:
    bVar13 = true;
  }
  else {
    bVar13 = true;
    if (dVar1 < 2147483647.0) {
      local_c8 = (int)dVar1;
      if ((dVar1 != (double)(int)dVar1) || (NAN(dVar1) || NAN((double)(int)dVar1)))
      goto LAB_001c7f21;
      bVar13 = false;
    }
  }
  if (bVar13) {
    bVar13 = true;
  }
  else if ((long)op_00->ch1 == -1) {
    op_00 = (xmlXPathStepOpPtr)0x0;
    bVar13 = true;
    bVar14 = false;
  }
  else {
    op_00 = pxVar6 + op_00->ch1;
    bVar13 = false;
  }
LAB_001c7fa0:
  bVar25 = toBool == 0;
  bVar26 = op_00 != (xmlXPathStepOpPtr)0x0;
  pxVar8 = ctxt_00->node;
  if (pxVar5->nodeNr < 1) {
    local_b8 = (xmlNodeSetPtr)0x0;
    cur = local_b8;
LAB_001c86ee:
    local_b8 = cur;
    cur = (xmlNodeSetPtr)0x0;
  }
  else {
    lVar22 = 0;
    iVar16 = 0xb;
    if (bVar25 || bVar26) {
      iVar16 = 0;
    }
    iVar24 = 0;
    cur = (xmlNodeSetPtr)0x0;
    local_b8 = (xmlNodeSetPtr)0x0;
    while (ctxt->error == 0) {
      ctxt_00->node = pxVar5->nodeTab[lVar22];
      if (cur == (xmlNodeSetPtr)0x0) {
        cur = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
        if (cur == (xmlNodeSetPtr)0x0) {
          cur = (xmlNodeSetPtr)0x0;
        }
        else {
          cur->nodeNr = 0;
          cur->nodeMax = 0;
          cur->nodeTab = (xmlNodePtr *)0x0;
        }
        if (cur == (xmlNodeSetPtr)0x0) {
          cur = (xmlNodeSetPtr)0x0;
          iVar24 = 0;
LAB_001c8830:
          xmlXPathPErrMemory(ctxt);
          break;
        }
      }
      lVar22 = lVar22 + 1;
      node2 = (xmlNodePtr)0x0;
      iVar18 = 0;
      local_c4 = 0;
      do {
        if ((ctxt->context->opLimit != 0) && (iVar17 = xmlXPathCheckOpLimit(ctxt,1), iVar17 < 0))
        goto LAB_001c86fb;
        node2 = (xmlNodePtr)(*pcVar21)(ctxt,node2);
        if (((node2 == (xmlNodePtr)0x0) ||
            (((local_a8 != (xmlNodePtr *)0x0 && (pxVar9 = *local_a8, pxVar9 != (xmlNodePtr)0x0)) &&
             ((pxVar9 == node2 ||
              (((char)iVar24 == '\0' && (iVar17 = xmlXPathCmpNodesExt(pxVar9,node2), -1 < iVar17))))
             )))) || ((local_d8 != (xmlNodePtr *)0x0 &&
                      ((pxVar9 = *local_d8, pxVar9 != (xmlNodePtr)0x0 &&
                       ((pxVar9 == node2 ||
                        (((char)iVar24 == '\0' &&
                         (iVar17 = xmlXPathCmpNodesExt(node2,pxVar9), -1 < iVar17)))))))))) break;
        iVar24 = iVar24 + 1;
        switch(iVar2) {
        case 0:
          iVar24 = iVar2;
          goto LAB_001c86fb;
        case 1:
          xVar4 = node2->type;
          if (xVar3 == 0) {
            if (XML_NAMESPACE_DECL < xVar4) break;
            if ((0x239eU >> (xVar4 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)
            goto LAB_001c833b;
            if (xVar4 != XML_NAMESPACE_DECL) break;
            if (iVar23 == 9) goto LAB_001c823b;
            if (bVar14) {
              iVar17 = xmlXPathNodeSetAddUnique(cur,node2);
              goto LAB_001c825c;
            }
            local_c4 = 1;
          }
          else {
            if (xVar4 == xVar3) {
              if (xVar4 == XML_NAMESPACE_DECL) goto LAB_001c823b;
            }
            else if ((xVar3 != XML_TEXT_NODE) || (xVar4 != XML_CDATA_SECTION_NODE)) break;
LAB_001c833b:
            if (bVar14) {
LAB_001c8342:
              iVar17 = xmlXPathNodeSetAddUnique(cur,node2);
              if (iVar17 < 0) {
                xmlXPathPErrMemory(ctxt);
              }
LAB_001c835b:
              if (bVar25 || bVar26) break;
LAB_001c87f3:
              if (local_b8 == (xmlNodeSetPtr)0x0) goto LAB_001c86ee;
              local_b8 = (xmlNodeSetPtr)(*local_98)(local_b8,cur);
              if (local_b8 != (xmlNodeSetPtr)0x0) goto LAB_001c86fb;
              local_b8 = (xmlNodeSetPtr)0x0;
              goto LAB_001c8830;
            }
          }
          iVar18 = iVar18 + 1;
          if (iVar18 == local_c8) {
LAB_001c8674:
            iVar18 = xmlXPathNodeSetAddUnique(cur,node2);
LAB_001c86b0:
            if (iVar18 < 0) {
              xmlXPathPErrMemory(ctxt);
            }
            goto joined_r0x001c86ca;
          }
          break;
        case 2:
          if ((node2->type == XML_PI_NODE) &&
             ((str2 == (xmlChar *)0x0 || (iVar17 = xmlStrEqual(str2,node2->name), iVar17 != 0))))
          goto LAB_001c833b;
          break;
        case 3:
          xVar4 = node2->type;
          if (iVar23 == 9) {
            if (xVar4 != XML_NAMESPACE_DECL) break;
LAB_001c823b:
            if (bVar14) {
              iVar17 = xmlXPathNodeSetAddNs(cur,ctxt_00->node,(xmlNsPtr)node2);
LAB_001c825c:
              if (iVar17 < 0) {
                xmlXPathPErrMemory(ctxt);
              }
              local_c4 = 1;
              goto LAB_001c835b;
            }
            iVar18 = iVar18 + 1;
            if (iVar18 != local_c8) break;
            iVar18 = xmlXPathNodeSetAddNs(cur,ctxt_00->node,(xmlNsPtr)node2);
            goto LAB_001c86b0;
          }
          if (iVar23 == 3) {
            if (xVar4 == XML_ATTRIBUTE_NODE) {
LAB_001c82d2:
              if (prefix == (xmlChar *)0x0) goto LAB_001c833b;
              pxVar10 = node2->ns;
joined_r0x001c82c5:
              if ((pxVar10 == (xmlNs *)0x0) ||
                 (iVar17 = xmlStrEqual(str1,pxVar10->href), iVar17 == 0)) break;
              if (bVar14) goto LAB_001c8342;
              iVar18 = iVar18 + 1;
              if (iVar18 != local_c8) break;
              goto LAB_001c8674;
            }
          }
          else if (xVar4 == XML_ELEMENT_NODE) goto LAB_001c82d2;
          break;
        case 5:
          xVar4 = node2->type;
          if (iVar23 == 9) {
            if (xVar4 == XML_NAMESPACE_DECL) goto LAB_001c827e;
          }
          else if (iVar23 == 3) {
            if (xVar4 == XML_ATTRIBUTE_NODE) {
LAB_001c827e:
              xVar4 = node2->type;
              if (xVar4 == XML_NAMESPACE_DECL) {
                iVar17 = 0;
                if (node2->children != (_xmlNode *)0x0 && str2 != (xmlChar *)0x0) {
                  iVar17 = xmlStrEqual((xmlChar *)node2->children,str2);
                  if (iVar17 == 0) {
LAB_001c852d:
                    iVar17 = 0;
                  }
                  else {
                    if (bVar14) {
                      iVar19 = xmlXPathNodeSetAddNs(cur,ctxt_00->node,(xmlNsPtr)node2);
                      iVar17 = iVar16;
                    }
                    else {
                      iVar18 = iVar18 + 1;
                      if (iVar18 != local_c8) goto LAB_001c852d;
                      iVar19 = xmlXPathNodeSetAddNs(cur,ctxt_00->node,(xmlNsPtr)node2);
                      iVar17 = 10;
                    }
                    local_c4 = 1;
                    if (iVar19 < 0) {
                      xmlXPathPErrMemory(ctxt);
                      local_c4 = 1;
                    }
                  }
                }
                if (iVar17 == 0) break;
                if (iVar17 != 10) {
                  if (iVar17 != 0xb) {
                    return iVar24;
                  }
                  goto LAB_001c87f3;
                }
                goto joined_r0x001c86ca;
              }
              if (xVar4 != XML_ATTRIBUTE_NODE) {
                if ((xVar4 == XML_ELEMENT_NODE) &&
                   (iVar17 = xmlStrEqual(str2,node2->name), iVar17 != 0)) {
                  pxVar10 = node2->ns;
                  if (prefix != (xmlChar *)0x0) goto joined_r0x001c82c5;
                  if (pxVar10 == (xmlNs *)0x0) goto LAB_001c833b;
                }
                break;
              }
              iVar19 = xmlStrEqual(str2,node2->name);
              iVar17 = iVar18;
              if (iVar19 == 0) {
LAB_001c83fe:
                iVar19 = 0xc;
                iVar18 = iVar17;
              }
              else {
                pxVar10 = node2->ns;
                if (prefix != (xmlChar *)0x0) {
                  if ((pxVar10 != (xmlNs *)0x0) &&
                     (iVar19 = xmlStrEqual(str1,pxVar10->href), iVar19 != 0)) {
                    if (bVar14) goto LAB_001c8495;
                    iVar17 = iVar18 + 1;
                    if (iVar17 == local_c8) goto LAB_001c856f;
                  }
                  goto LAB_001c83fe;
                }
                if ((pxVar10 != (xmlNs *)0x0) && (pxVar10->prefix != (xmlChar *)0x0))
                goto LAB_001c83fe;
                if (bVar14) {
LAB_001c8495:
                  iVar19 = xmlXPathNodeSetAddUnique(cur,node2);
                  if (iVar19 < 0) {
                    xmlXPathPErrMemory(ctxt);
                  }
                  iVar19 = 0xb;
                  if (bVar25 || bVar26) goto LAB_001c83fe;
                }
                else {
                  iVar17 = iVar18 + 1;
                  if (iVar18 + 1 != local_c8) goto LAB_001c83fe;
LAB_001c856f:
                  iVar18 = iVar18 + 1;
                  iVar17 = xmlXPathNodeSetAddUnique(cur,node2);
                  if (iVar17 < 0) {
                    xmlXPathPErrMemory(ctxt);
                  }
                  iVar19 = 10;
                }
              }
              if (iVar19 != 0xc) {
                if (iVar19 != 10) goto LAB_001c87f3;
                goto joined_r0x001c86ca;
              }
            }
          }
          else if (xVar4 == XML_ELEMENT_NODE) goto LAB_001c827e;
        }
      } while (ctxt->error == 0);
      if (ctxt->error != 0) break;
      if ((op_00 != (xmlXPathStepOpPtr)0x0) && (0 < cur->nodeNr)) {
        iVar18 = local_c8;
        iVar17 = local_c8;
        if (bVar13) {
          iVar18 = 1;
          iVar17 = cur->nodeNr;
        }
        xmlXPathCompOpEvalPredicate(ctxt,op_00,cur,iVar18,iVar17,local_c4);
        if (ctxt->error != 0) {
          iVar24 = 0;
          break;
        }
      }
      if (0 < cur->nodeNr) {
joined_r0x001c86ca:
        if (local_b8 == (xmlNodeSetPtr)0x0) {
          pxVar15 = (xmlNodeSetPtr)0x0;
          local_b8 = cur;
        }
        else {
          local_b8 = (xmlNodeSetPtr)(*local_98)(local_b8,cur);
          pxVar15 = cur;
          if (local_b8 == (xmlNodeSetPtr)0x0) {
            xmlXPathPErrMemory(ctxt);
            local_b8 = (xmlNodeSetPtr)0x0;
          }
        }
        cur = pxVar15;
        if (toBool != 0) break;
      }
      if (pxVar5->nodeNr <= lVar22) break;
    }
  }
LAB_001c86fb:
  if ((pxVar20->boolval != 0) && (pvVar11 = pxVar20->user, pvVar11 != (void *)0x0)) {
    pxVar12 = ctxt->value;
    pxVar12->boolval = 1;
    pxVar12->user = pvVar11;
    pxVar20->user = (void *)0x0;
    pxVar20->boolval = 0;
  }
  xmlXPathReleaseObject(ctxt_00,pxVar20);
  if ((local_b8 == (xmlNodeSetPtr)0x0) &&
     ((cur == (xmlNodeSetPtr)0x0 || (local_b8 = cur, cur->nodeNr != 0)))) {
    local_b8 = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
    if (local_b8 == (xmlNodeSetPtr)0x0) {
      local_b8 = (xmlNodeSetPtr)0x0;
    }
    else {
      local_b8->nodeNr = 0;
      local_b8->nodeMax = 0;
      local_b8->nodeTab = (xmlNodePtr *)0x0;
    }
    if (local_b8 == (xmlNodeSetPtr)0x0) {
      xmlXPathPErrMemory(ctxt);
      local_b8 = (xmlNodeSetPtr)0x0;
    }
  }
  if ((cur != (xmlNodeSetPtr)0x0) && (cur != local_b8)) {
    xmlXPathFreeNodeSet(cur);
  }
  pxVar20 = xmlXPathCacheWrapNodeSet(ctxt,local_b8);
  xmlXPathValuePush(ctxt,pxVar20);
  ctxt_00->node = pxVar8;
  if (ctxt_00->tmpNsList != (xmlNsPtr *)0x0) {
    (*xmlFree)(ctxt_00->tmpNsList);
    ctxt_00->tmpNsList = (xmlNsPtr *)0x0;
    return iVar24;
  }
  return iVar24;
}

Assistant:

static int
xmlXPathNodeCollectAndTest(xmlXPathParserContextPtr ctxt,
                           xmlXPathStepOpPtr op,
			   xmlNodePtr * first, xmlNodePtr * last,
			   int toBool)
{

#define XP_TEST_HIT \
    if (hasAxisRange != 0) { \
	if (++pos == maxPos) { \
	    if (addNode(seq, cur) < 0) \
	        xmlXPathPErrMemory(ctxt); \
	    goto axis_range_end; } \
    } else { \
	if (addNode(seq, cur) < 0) \
	    xmlXPathPErrMemory(ctxt); \
	if (breakOnFirstHit) goto first_hit; }

#define XP_TEST_HIT_NS \
    if (hasAxisRange != 0) { \
	if (++pos == maxPos) { \
	    hasNsNodes = 1; \
	    if (xmlXPathNodeSetAddNs(seq, xpctxt->node, (xmlNsPtr) cur) < 0) \
	        xmlXPathPErrMemory(ctxt); \
	goto axis_range_end; } \
    } else { \
	hasNsNodes = 1; \
	if (xmlXPathNodeSetAddNs(seq, xpctxt->node, (xmlNsPtr) cur) < 0) \
	    xmlXPathPErrMemory(ctxt); \
	if (breakOnFirstHit) goto first_hit; }

    xmlXPathAxisVal axis = (xmlXPathAxisVal) op->value;
    xmlXPathTestVal test = (xmlXPathTestVal) op->value2;
    xmlXPathTypeVal type = (xmlXPathTypeVal) op->value3;
    const xmlChar *prefix = op->value4;
    const xmlChar *name = op->value5;
    const xmlChar *URI = NULL;

    int total = 0, hasNsNodes = 0;
    /* The popped object holding the context nodes */
    xmlXPathObjectPtr obj;
    /* The set of context nodes for the node tests */
    xmlNodeSetPtr contextSeq;
    int contextIdx;
    xmlNodePtr contextNode;
    /* The final resulting node set wrt to all context nodes */
    xmlNodeSetPtr outSeq;
    /*
    * The temporary resulting node set wrt 1 context node.
    * Used to feed predicate evaluation.
    */
    xmlNodeSetPtr seq;
    xmlNodePtr cur;
    /* First predicate operator */
    xmlXPathStepOpPtr predOp;
    int maxPos; /* The requested position() (when a "[n]" predicate) */
    int hasPredicateRange, hasAxisRange, pos;
    int breakOnFirstHit;

    xmlXPathTraversalFunction next = NULL;
    int (*addNode) (xmlNodeSetPtr, xmlNodePtr);
    xmlXPathNodeSetMergeFunction mergeAndClear;
    xmlNodePtr oldContextNode;
    xmlXPathContextPtr xpctxt = ctxt->context;


    CHECK_TYPE0(XPATH_NODESET);
    obj = xmlXPathValuePop(ctxt);
    /*
    * Setup namespaces.
    */
    if (prefix != NULL) {
        URI = xmlXPathNsLookup(xpctxt, prefix);
        if (URI == NULL) {
	    xmlXPathReleaseObject(xpctxt, obj);
            XP_ERROR0(XPATH_UNDEF_PREFIX_ERROR);
	}
    }
    /*
    * Setup axis.
    *
    * MAYBE FUTURE TODO: merging optimizations:
    * - If the nodes to be traversed wrt to the initial nodes and
    *   the current axis cannot overlap, then we could avoid searching
    *   for duplicates during the merge.
    *   But the question is how/when to evaluate if they cannot overlap.
    *   Example: if we know that for two initial nodes, the one is
    *   not in the ancestor-or-self axis of the other, then we could safely
    *   avoid a duplicate-aware merge, if the axis to be traversed is e.g.
    *   the descendant-or-self axis.
    */
    mergeAndClear = xmlXPathNodeSetMergeAndClear;
    switch (axis) {
        case AXIS_ANCESTOR:
            first = NULL;
            next = xmlXPathNextAncestor;
            break;
        case AXIS_ANCESTOR_OR_SELF:
            first = NULL;
            next = xmlXPathNextAncestorOrSelf;
            break;
        case AXIS_ATTRIBUTE:
            first = NULL;
	    last = NULL;
            next = xmlXPathNextAttribute;
	    mergeAndClear = xmlXPathNodeSetMergeAndClearNoDupls;
            break;
        case AXIS_CHILD:
	    last = NULL;
	    if (((test == NODE_TEST_NAME) || (test == NODE_TEST_ALL)) &&
		(type == NODE_TYPE_NODE))
	    {
		/*
		* Optimization if an element node type is 'element'.
		*/
		next = xmlXPathNextChildElement;
	    } else
		next = xmlXPathNextChild;
	    mergeAndClear = xmlXPathNodeSetMergeAndClearNoDupls;
            break;
        case AXIS_DESCENDANT:
	    last = NULL;
            next = xmlXPathNextDescendant;
            break;
        case AXIS_DESCENDANT_OR_SELF:
	    last = NULL;
            next = xmlXPathNextDescendantOrSelf;
            break;
        case AXIS_FOLLOWING:
	    last = NULL;
            next = xmlXPathNextFollowing;
            break;
        case AXIS_FOLLOWING_SIBLING:
	    last = NULL;
            next = xmlXPathNextFollowingSibling;
            break;
        case AXIS_NAMESPACE:
            first = NULL;
	    last = NULL;
            next = (xmlXPathTraversalFunction) xmlXPathNextNamespace;
	    mergeAndClear = xmlXPathNodeSetMergeAndClearNoDupls;
            break;
        case AXIS_PARENT:
            first = NULL;
            next = xmlXPathNextParent;
            break;
        case AXIS_PRECEDING:
            first = NULL;
            next = xmlXPathNextPrecedingInternal;
            break;
        case AXIS_PRECEDING_SIBLING:
            first = NULL;
            next = xmlXPathNextPrecedingSibling;
            break;
        case AXIS_SELF:
            first = NULL;
	    last = NULL;
            next = xmlXPathNextSelf;
	    mergeAndClear = xmlXPathNodeSetMergeAndClearNoDupls;
            break;
    }

    if (next == NULL) {
	xmlXPathReleaseObject(xpctxt, obj);
        return(0);
    }
    contextSeq = obj->nodesetval;
    if ((contextSeq == NULL) || (contextSeq->nodeNr <= 0)) {
        xmlXPathValuePush(ctxt, obj);
        return(0);
    }
    /*
    * Predicate optimization ---------------------------------------------
    * If this step has a last predicate, which contains a position(),
    * then we'll optimize (although not exactly "position()", but only
    * the  short-hand form, i.e., "[n]".
    *
    * Example - expression "/foo[parent::bar][1]":
    *
    * COLLECT 'child' 'name' 'node' foo    -- op (we are here)
    *   ROOT                               -- op->ch1
    *   PREDICATE                          -- op->ch2 (predOp)
    *     PREDICATE                          -- predOp->ch1 = [parent::bar]
    *       SORT
    *         COLLECT  'parent' 'name' 'node' bar
    *           NODE
    *     ELEM Object is a number : 1        -- predOp->ch2 = [1]
    *
    */
    maxPos = 0;
    predOp = NULL;
    hasPredicateRange = 0;
    hasAxisRange = 0;
    if (op->ch2 != -1) {
	/*
	* There's at least one predicate. 16 == XPATH_OP_PREDICATE
	*/
	predOp = &ctxt->comp->steps[op->ch2];
	if (xmlXPathIsPositionalPredicate(ctxt, predOp, &maxPos)) {
	    if (predOp->ch1 != -1) {
		/*
		* Use the next inner predicate operator.
		*/
		predOp = &ctxt->comp->steps[predOp->ch1];
		hasPredicateRange = 1;
	    } else {
		/*
		* There's no other predicate than the [n] predicate.
		*/
		predOp = NULL;
		hasAxisRange = 1;
	    }
	}
    }
    breakOnFirstHit = ((toBool) && (predOp == NULL)) ? 1 : 0;
    /*
    * Axis traversal -----------------------------------------------------
    */
    /*
     * 2.3 Node Tests
     *  - For the attribute axis, the principal node type is attribute.
     *  - For the namespace axis, the principal node type is namespace.
     *  - For other axes, the principal node type is element.
     *
     * A node test * is true for any node of the
     * principal node type. For example, child::* will
     * select all element children of the context node
     */
    oldContextNode = xpctxt->node;
    addNode = xmlXPathNodeSetAddUnique;
    outSeq = NULL;
    seq = NULL;
    contextNode = NULL;
    contextIdx = 0;


    while (((contextIdx < contextSeq->nodeNr) || (contextNode != NULL)) &&
           (ctxt->error == XPATH_EXPRESSION_OK)) {
	xpctxt->node = contextSeq->nodeTab[contextIdx++];

	if (seq == NULL) {
	    seq = xmlXPathNodeSetCreate(NULL);
	    if (seq == NULL) {
                xmlXPathPErrMemory(ctxt);
		total = 0;
		goto error;
	    }
	}
	/*
	* Traverse the axis and test the nodes.
	*/
	pos = 0;
	cur = NULL;
	hasNsNodes = 0;
        do {
            if (OP_LIMIT_EXCEEDED(ctxt, 1))
                goto error;

            cur = next(ctxt, cur);
            if (cur == NULL)
                break;

	    /*
	    * QUESTION TODO: What does the "first" and "last" stuff do?
	    */
            if ((first != NULL) && (*first != NULL)) {
		if (*first == cur)
		    break;
		if (((total % 256) == 0) &&
#ifdef XP_OPTIMIZED_NON_ELEM_COMPARISON
		    (xmlXPathCmpNodesExt(*first, cur) >= 0))
#else
		    (xmlXPathCmpNodes(*first, cur) >= 0))
#endif
		{
		    break;
		}
	    }
	    if ((last != NULL) && (*last != NULL)) {
		if (*last == cur)
		    break;
		if (((total % 256) == 0) &&
#ifdef XP_OPTIMIZED_NON_ELEM_COMPARISON
		    (xmlXPathCmpNodesExt(cur, *last) >= 0))
#else
		    (xmlXPathCmpNodes(cur, *last) >= 0))
#endif
		{
		    break;
		}
	    }

            total++;

	    switch (test) {
                case NODE_TEST_NONE:
		    total = 0;
		    goto error;
                case NODE_TEST_TYPE:
		    if (type == NODE_TYPE_NODE) {
			switch (cur->type) {
			    case XML_DOCUMENT_NODE:
			    case XML_HTML_DOCUMENT_NODE:
			    case XML_ELEMENT_NODE:
			    case XML_ATTRIBUTE_NODE:
			    case XML_PI_NODE:
			    case XML_COMMENT_NODE:
			    case XML_CDATA_SECTION_NODE:
			    case XML_TEXT_NODE:
				XP_TEST_HIT
				break;
			    case XML_NAMESPACE_DECL: {
				if (axis == AXIS_NAMESPACE) {
				    XP_TEST_HIT_NS
				} else {
	                            hasNsNodes = 1;
				    XP_TEST_HIT
				}
				break;
                            }
			    default:
				break;
			}
		    } else if (cur->type == (xmlElementType) type) {
			if (cur->type == XML_NAMESPACE_DECL)
			    XP_TEST_HIT_NS
			else
			    XP_TEST_HIT
		    } else if ((type == NODE_TYPE_TEXT) &&
			 (cur->type == XML_CDATA_SECTION_NODE))
		    {
			XP_TEST_HIT
		    }
		    break;
                case NODE_TEST_PI:
                    if ((cur->type == XML_PI_NODE) &&
                        ((name == NULL) || xmlStrEqual(name, cur->name)))
		    {
			XP_TEST_HIT
                    }
                    break;
                case NODE_TEST_ALL:
                    if (axis == AXIS_ATTRIBUTE) {
                        if (cur->type == XML_ATTRIBUTE_NODE)
			{
                            if (prefix == NULL)
			    {
				XP_TEST_HIT
                            } else if ((cur->ns != NULL) &&
				(xmlStrEqual(URI, cur->ns->href)))
			    {
				XP_TEST_HIT
                            }
                        }
                    } else if (axis == AXIS_NAMESPACE) {
                        if (cur->type == XML_NAMESPACE_DECL)
			{
			    XP_TEST_HIT_NS
                        }
                    } else {
                        if (cur->type == XML_ELEMENT_NODE) {
                            if (prefix == NULL)
			    {
				XP_TEST_HIT

                            } else if ((cur->ns != NULL) &&
				(xmlStrEqual(URI, cur->ns->href)))
			    {
				XP_TEST_HIT
                            }
                        }
                    }
                    break;
                case NODE_TEST_NS:{
                        /* TODO */
                        break;
                    }
                case NODE_TEST_NAME:
                    if (axis == AXIS_ATTRIBUTE) {
                        if (cur->type != XML_ATTRIBUTE_NODE)
			    break;
		    } else if (axis == AXIS_NAMESPACE) {
                        if (cur->type != XML_NAMESPACE_DECL)
			    break;
		    } else {
		        if (cur->type != XML_ELEMENT_NODE)
			    break;
		    }
                    switch (cur->type) {
                        case XML_ELEMENT_NODE:
                            if (xmlStrEqual(name, cur->name)) {
                                if (prefix == NULL) {
                                    if (cur->ns == NULL)
				    {
					XP_TEST_HIT
                                    }
                                } else {
                                    if ((cur->ns != NULL) &&
                                        (xmlStrEqual(URI, cur->ns->href)))
				    {
					XP_TEST_HIT
                                    }
                                }
                            }
                            break;
                        case XML_ATTRIBUTE_NODE:{
                                xmlAttrPtr attr = (xmlAttrPtr) cur;

                                if (xmlStrEqual(name, attr->name)) {
                                    if (prefix == NULL) {
                                        if ((attr->ns == NULL) ||
                                            (attr->ns->prefix == NULL))
					{
					    XP_TEST_HIT
                                        }
                                    } else {
                                        if ((attr->ns != NULL) &&
                                            (xmlStrEqual(URI,
					      attr->ns->href)))
					{
					    XP_TEST_HIT
                                        }
                                    }
                                }
                                break;
                            }
                        case XML_NAMESPACE_DECL:
                            if (cur->type == XML_NAMESPACE_DECL) {
                                xmlNsPtr ns = (xmlNsPtr) cur;

                                if ((ns->prefix != NULL) && (name != NULL)
                                    && (xmlStrEqual(ns->prefix, name)))
				{
				    XP_TEST_HIT_NS
                                }
                            }
                            break;
                        default:
                            break;
                    }
                    break;
	    } /* switch(test) */
        } while ((cur != NULL) && (ctxt->error == XPATH_EXPRESSION_OK));

	goto apply_predicates;

axis_range_end: /* ----------------------------------------------------- */
	/*
	* We have a "/foo[n]", and position() = n was reached.
	* Note that we can have as well "/foo/::parent::foo[1]", so
	* a duplicate-aware merge is still needed.
	* Merge with the result.
	*/
	if (outSeq == NULL) {
	    outSeq = seq;
	    seq = NULL;
	} else {
	    outSeq = mergeAndClear(outSeq, seq);
            if (outSeq == NULL)
                xmlXPathPErrMemory(ctxt);
        }
	/*
	* Break if only a true/false result was requested.
	*/
	if (toBool)
	    break;
	continue;

first_hit: /* ---------------------------------------------------------- */
	/*
	* Break if only a true/false result was requested and
	* no predicates existed and a node test succeeded.
	*/
	if (outSeq == NULL) {
	    outSeq = seq;
	    seq = NULL;
	} else {
	    outSeq = mergeAndClear(outSeq, seq);
            if (outSeq == NULL)
                xmlXPathPErrMemory(ctxt);
        }
	break;

apply_predicates: /* --------------------------------------------------- */
        if (ctxt->error != XPATH_EXPRESSION_OK)
	    goto error;

        /*
	* Apply predicates.
	*/
        if ((predOp != NULL) && (seq->nodeNr > 0)) {
	    /*
	    * E.g. when we have a "/foo[some expression][n]".
	    */
	    /*
	    * QUESTION TODO: The old predicate evaluation took into
	    *  account location-sets.
	    *  (E.g. ctxt->value->type == XPATH_LOCATIONSET)
	    *  Do we expect such a set here?
	    *  All what I learned now from the evaluation semantics
	    *  does not indicate that a location-set will be processed
	    *  here, so this looks OK.
	    */
	    /*
	    * Iterate over all predicates, starting with the outermost
	    * predicate.
	    * TODO: Problem: we cannot execute the inner predicates first
	    *  since we cannot go back *up* the operator tree!
	    *  Options we have:
	    *  1) Use of recursive functions (like is it currently done
	    *     via xmlXPathCompOpEval())
	    *  2) Add a predicate evaluation information stack to the
	    *     context struct
	    *  3) Change the way the operators are linked; we need a
	    *     "parent" field on xmlXPathStepOp
	    *
	    * For the moment, I'll try to solve this with a recursive
	    * function: xmlXPathCompOpEvalPredicate().
	    */
	    if (hasPredicateRange != 0)
		xmlXPathCompOpEvalPredicate(ctxt, predOp, seq, maxPos, maxPos,
					    hasNsNodes);
	    else
		xmlXPathCompOpEvalPredicate(ctxt, predOp, seq, 1, seq->nodeNr,
					    hasNsNodes);

	    if (ctxt->error != XPATH_EXPRESSION_OK) {
		total = 0;
		goto error;
	    }
        }

        if (seq->nodeNr > 0) {
	    /*
	    * Add to result set.
	    */
	    if (outSeq == NULL) {
		outSeq = seq;
		seq = NULL;
	    } else {
		outSeq = mergeAndClear(outSeq, seq);
                if (outSeq == NULL)
                    xmlXPathPErrMemory(ctxt);
	    }

            if (toBool)
                break;
	}
    }

error:
    if ((obj->boolval) && (obj->user != NULL)) {
	/*
	* QUESTION TODO: What does this do and why?
	* TODO: Do we have to do this also for the "error"
	* cleanup further down?
	*/
	ctxt->value->boolval = 1;
	ctxt->value->user = obj->user;
	obj->user = NULL;
	obj->boolval = 0;
    }
    xmlXPathReleaseObject(xpctxt, obj);

    /*
    * Ensure we return at least an empty set.
    */
    if (outSeq == NULL) {
	if ((seq != NULL) && (seq->nodeNr == 0)) {
	    outSeq = seq;
        } else {
	    outSeq = xmlXPathNodeSetCreate(NULL);
            if (outSeq == NULL)
                xmlXPathPErrMemory(ctxt);
        }
    }
    if ((seq != NULL) && (seq != outSeq)) {
	 xmlXPathFreeNodeSet(seq);
    }
    /*
    * Hand over the result. Better to push the set also in
    * case of errors.
    */
    xmlXPathValuePush(ctxt, xmlXPathCacheWrapNodeSet(ctxt, outSeq));
    /*
    * Reset the context node.
    */
    xpctxt->node = oldContextNode;
    /*
    * When traversing the namespace axis in "toBool" mode, it's
    * possible that tmpNsList wasn't freed.
    */
    if (xpctxt->tmpNsList != NULL) {
        xmlFree(xpctxt->tmpNsList);
        xpctxt->tmpNsList = NULL;
    }

    return(total);
}